

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O0

void continuous_dist_test_icdf<trng::maxwell_dist<double>>(maxwell_dist<double> *d)

{
  StringRef capturedExpression;
  bool bVar1;
  reference pvVar2;
  reference pdVar3;
  int iVar4;
  undefined8 in_RDI;
  StringRef *macroName;
  double extraout_XMM0_Qa;
  maxwell_dist<double> *extraout_XMM0_Qa_00;
  AssertionHandler catchAssertionHandler;
  result_type y;
  result_type x;
  double p;
  iterator __end0;
  iterator __begin0;
  vector<double,_std::allocator<double>_> *__range1;
  int i;
  vector<double,_std::allocator<double>_> p_values;
  double eps;
  ExprLhs<const_double_&> in_stack_fffffffffffffe78;
  AssertionHandler *in_stack_fffffffffffffe80;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe88;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe98;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffea0;
  vector<double,_std::allocator<double>_> *this;
  maxwell_dist<double> *in_stack_fffffffffffffeb0;
  AssertionHandler local_f8;
  result_type_conflict2 local_90;
  StringRef *local_88;
  double local_80;
  double *local_78;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_70;
  vector<double,_std::allocator<double>_> *local_68;
  double *local_60;
  double *local_58;
  double local_50;
  double local_48;
  int local_40;
  undefined8 local_30;
  vector<double,_std::allocator<double>_> local_28;
  double local_10;
  undefined8 local_8;
  
  local_8 = in_RDI;
  local_10 = Catch::clara::std::numeric_limits<double>::epsilon();
  local_10 = local_10 * 256.0;
  this = &local_28;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x34009b);
  local_30 = 0x3fe0000000000000;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe80,
             in_stack_fffffffffffffe78.m_lhs);
  for (local_40 = 2; local_40 < 0x35; local_40 = local_40 + 1) {
    in_stack_fffffffffffffea0 = &local_28;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_fffffffffffffea0,0);
    local_48 = pow(*pvVar2,(double)local_40);
    local_48 = local_48 + 0.0;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe80,
               in_stack_fffffffffffffe78.m_lhs);
    in_stack_fffffffffffffe98 = &local_28;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_fffffffffffffe98,0);
    local_50 = pow(*pvVar2,(double)local_40);
    local_50 = 1.0 - local_50;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe80,
               in_stack_fffffffffffffe78.m_lhs);
  }
  __first._M_current = (double *)&local_28;
  local_58 = (double *)
             std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe78.m_lhs);
  local_60 = (double *)
             std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffe78.m_lhs);
  std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (__first,in_stack_fffffffffffffe88);
  local_68 = &local_28;
  local_70._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe78.m_lhs);
  local_78 = (double *)
             std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffe78.m_lhs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_fffffffffffffe80,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_fffffffffffffe78.m_lhs);
    if (!bVar1) break;
    pdVar3 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_70);
    local_80 = *pdVar3;
    macroName = (StringRef *)
                trng::maxwell_dist<double>::icdf
                          ((maxwell_dist<double> *)this,
                           (result_type_conflict2)in_stack_fffffffffffffea0);
    iVar4 = (int)local_8;
    local_88 = macroName;
    local_90 = trng::maxwell_dist<double>::cdf
                         (in_stack_fffffffffffffeb0,(result_type_conflict2)this);
    Catch::clara::std::abs(iVar4);
    if (5.6843418860808015e-14 <= extraout_XMM0_Qa) {
      local_f8.m_assertionInfo.lineInfo =
           (SourceLineInfo)
           operator____catch_sr
                     ((char *)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78.m_lhs);
      in_stack_fffffffffffffe80 = &local_f8;
      Catch::SourceLineInfo::SourceLineInfo
                ((SourceLineInfo *)in_stack_fffffffffffffe80,
                 "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
                 ,0xa8);
      Catch::StringRef::StringRef((StringRef *)__first._M_current,(char *)macroName);
      iVar4 = (int)&local_f8 + 0x20;
      capturedExpression.m_size = (size_type)in_stack_fffffffffffffea0;
      capturedExpression.m_start = (char *)in_stack_fffffffffffffe98;
      Catch::AssertionHandler::AssertionHandler
                ((AssertionHandler *)__first._M_current,macroName,
                 (SourceLineInfo *)in_stack_fffffffffffffe80,capturedExpression,
                 (Flags)((ulong)in_stack_fffffffffffffe78.m_lhs >> 0x20));
      Catch::clara::std::abs(iVar4);
      in_stack_fffffffffffffeb0 = extraout_XMM0_Qa_00;
      in_stack_fffffffffffffe78 =
           Catch::Decomposer::operator<=(in_stack_fffffffffffffe78.m_lhs,(double *)0x34038f);
      Catch::ExprLhs<double_const&>::operator<
                ((ExprLhs<const_double_&> *)this,(double *)in_stack_fffffffffffffea0);
      Catch::AssertionHandler::handleExpr
                (in_stack_fffffffffffffe80,(ITransientExpression *)in_stack_fffffffffffffe78.m_lhs);
      Catch::BinaryExpr<const_double_&,_const_double_&>::~BinaryExpr
                ((BinaryExpr<const_double_&,_const_double_&> *)0x3403d5);
      Catch::AssertionHandler::complete(in_stack_fffffffffffffe80);
      Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffe80);
    }
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_70);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)__first._M_current);
  return;
}

Assistant:

void continuous_dist_test_icdf(const dist &d) {
  using result_type = typename dist::result_type;
  const auto eps{256 * std::numeric_limits<result_type>::epsilon()};
  std::vector<result_type> p_values;
  p_values.push_back(result_type{1} / result_type{2});
  for (int i{2}; i < std::numeric_limits<result_type>::digits; ++i) {
    p_values.push_back(result_type{0} + std::pow(p_values[0], result_type(i)));
    p_values.push_back(result_type{1} - std::pow(p_values[0], result_type(i)));
  }
  std::sort(p_values.begin(), p_values.end());
  for (const auto p : p_values) {
    const result_type x{d.icdf(p)};
    const result_type y{d.cdf(x)};
    if (not(std::abs(y - p) <
            eps))  // switch into REQUIRE macro in failure case only, for performance reasons
      REQUIRE(std::abs(y - p) < eps);
  }
}